

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLParsingTools.hpp
# Opt level: O1

string * __thiscall
Diligent::Parsing::
ExtractGLSLImageFormatFromComment<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (string *__return_storage_ptr__,Parsing *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *Start,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *End)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos_1;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  bool bVar9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  pbVar6 = *(byte **)this;
  pbVar3 = (byte *)Start->_M_current;
  pbVar7 = pbVar6;
  while (((pbVar3 != pbVar6 && (pbVar7 = pbVar6, (ulong)*pbVar6 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
    pbVar7 = pbVar3;
  }
  if (((pbVar7 != pbVar3) && (*pbVar7 == 0x2f)) &&
     ((pbVar7 + 1 != pbVar3 && ((bVar1 = pbVar7[1], bVar1 == 0x2a || (bVar1 == 0x2f)))))) {
    pbVar7 = pbVar7 + 2;
    pbVar6 = pbVar7;
    while (((pbVar3 != pbVar7 && (pbVar6 = pbVar7, (ulong)*pbVar7 < 0x21)) &&
           ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0))) {
      pbVar7 = pbVar7 + 1;
      pbVar6 = pbVar3;
    }
    if (pbVar6 != pbVar3) {
      if ((pbVar3 == pbVar6) || (*pbVar6 != 0x66)) {
        bVar9 = false;
      }
      else {
        pbVar8 = (byte *)0x339d89;
        pbVar7 = pbVar6 + 1;
        pbVar4 = pbVar6 + 1;
        do {
          pbVar6 = pbVar4;
          bVar1 = *pbVar8;
          bVar9 = bVar1 == 0;
          if ((bVar9) || (pbVar7 == pbVar3)) break;
          pbVar8 = pbVar8 + 1;
          bVar2 = *pbVar7;
          pbVar7 = pbVar7 + 1;
          pbVar4 = pbVar6 + 1;
        } while (bVar1 == bVar2);
      }
      pbVar7 = pbVar6;
      if (bVar9) {
        while (((pbVar3 != pbVar7 && (pbVar6 = pbVar7, (ulong)*pbVar7 < 0x21)) &&
               ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0))) {
          pbVar6 = pbVar3;
          pbVar7 = pbVar7 + 1;
        }
        if ((pbVar6 != pbVar3) && (*pbVar6 == 0x3d)) {
          pbVar6 = pbVar6 + 1;
          local_18._M_current = (char *)pbVar6;
          while (((pbVar3 != pbVar6 && (local_18._M_current = (char *)pbVar6, (ulong)*pbVar6 < 0x21)
                  ) && ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
            pbVar6 = pbVar6 + 1;
            local_18._M_current = (char *)pbVar3;
          }
          if ((byte *)local_18._M_current != pbVar3) {
            _Var5 = SkipIdentifier<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                              (&local_18,Start);
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      ((string *)__return_storage_ptr__,local_18._M_current,_Var5._M_current);
            return __return_storage_ptr__;
          }
        }
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string ExtractGLSLImageFormatFromComment(const InteratorType& Start, const InteratorType& End)
{
    //    /* format = r32f */
    // ^
    auto Pos = SkipDelimiters(Start, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //    ^
    if (*Pos != '/')
        return {};

    ++Pos;
    //    /* format = r32f */
    //     ^
    //    // format = r32f
    //     ^
    if (Pos == End || (*Pos != '/' && *Pos != '*'))
        return {};

    ++Pos;
    //    /* format = r32f */
    //      ^
    Pos = SkipDelimiters(Pos, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //       ^
    if (!SkipString(Pos, End, "format", Pos))
        return {};

    //    /* format = r32f */
    //             ^
    Pos = SkipDelimiters(Pos, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //              ^
    if (*Pos != '=')
        return {};

    ++Pos;
    //    /* format = r32f */
    //               ^
    Pos = SkipDelimiters(Pos, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //                ^

    auto ImgFmtEndPos = SkipIdentifier(Pos, End);
    return {Pos, ImgFmtEndPos};
}